

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

void upb::generator::AddMessages
               (MessageDefPtr message,
               vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *messages)

{
  int iVar1;
  MessageDefPtr message_00;
  int local_1c;
  int i;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *messages_local;
  MessageDefPtr message_local;
  
  messages_local = (vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> *)message.ptr_;
  std::vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::push_back
            (messages,(value_type *)&messages_local);
  local_1c = 0;
  while( true ) {
    iVar1 = MessageDefPtr::nested_message_count((MessageDefPtr *)&messages_local);
    if (iVar1 <= local_1c) break;
    message_00 = MessageDefPtr::nested_message((MessageDefPtr *)&messages_local,local_1c);
    AddMessages(message_00,messages);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void AddMessages(upb::MessageDefPtr message,
                 std::vector<upb::MessageDefPtr>* messages) {
  messages->push_back(message);
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddMessages(message.nested_message(i), messages);
  }
}